

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O3

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,BOOL ucp,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  uint8_t **ppuVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  BOOL BVar8;
  ulong uVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  long lVar12;
  compile_block_8 *pcVar13;
  compile_block_8 *pcVar14;
  long lVar15;
  undefined1 uVar16;
  undefined4 in_register_00000014;
  long lVar17;
  uint *puVar18;
  uint8_t **ppuVar19;
  uint8_t **ppuVar20;
  uint uVar21;
  uint uVar22;
  byte *pbVar23;
  uint32_t list [8];
  int *in_stack_ffffffffffffff88;
  uint local_58;
  int local_54;
  uint local_50;
  
  lVar17 = CONCAT44(in_register_00000014,ucp);
  iVar4 = *(int *)base_end;
  uVar7 = iVar4 - 1;
  pcVar13 = (compile_block_8 *)(ulong)uVar7;
  *(uint *)base_end = uVar7;
  bVar5 = false;
  uVar7 = 0;
  if (1 < iVar4) {
    ppuVar1 = &cb->lcc;
    ppuVar20 = (uint8_t **)base_list;
LAB_001826a4:
    do {
      while( true ) {
        for (; bVar3 = (byte)*(uint32_t *)code, bVar3 == 0x76; code = (PCRE2_SPTR8)((long)code + 6))
        {
        }
        puVar10 = (uint32_t *)code;
        if (bVar3 != 0x77) break;
        code = (PCRE2_SPTR8)
               ((long)code +
               (ulong)(ushort)(*(ushort *)((long)code + 5) << 8 | *(ushort *)((long)code + 5) >> 8))
        ;
      }
      while (bVar3 == 0x78) {
        pcVar13 = (compile_block_8 *)
                  (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                 *(ushort *)((long)puVar10 + 1) >> 8);
        bVar3 = *(byte *)((long)puVar10 + (long)pcVar13);
        puVar10 = (uint32_t *)((long)puVar10 + (long)pcVar13);
      }
      uVar7 = bVar3 - 0x79;
      if (uVar7 < 0x20) {
        if ((0x15000U >> (uVar7 & 0x1f) & 1) != 0) {
          uVar9 = (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                 *(ushort *)((long)puVar10 + 1) >> 8);
          code = (PCRE2_SPTR8)
                 ((ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                         [bVar3] + (long)puVar10);
          pcVar13 = (compile_block_8 *)0x1;
          bVar5 = true;
          if (*(byte *)((long)puVar10 + uVar9) == 0x78) {
            pbVar23 = (byte *)((long)puVar10 + uVar9);
            do {
              pcVar13 = cb;
              ppuVar20 = (uint8_t **)base_list;
              BVar8 = compare_opcodes(code,utf,ucp,cb,base_list,base_end,in_stack_ffffffffffffff88);
              if (BVar8 == 0) {
                return 0;
              }
              code = pbVar23 + 3;
              uVar6 = *(ushort *)(pbVar23 + 1) << 8 | *(ushort *)(pbVar23 + 1) >> 8;
              pbVar2 = pbVar23 + uVar6;
              pbVar23 = pbVar23 + uVar6;
            } while (*pbVar2 == 0x78);
          }
          goto LAB_001826a4;
        }
        if ((9U >> (uVar7 & 0x1f) & 1) != 0) {
          if (*(int *)((long)&cb->cx + 4) == 0) {
            return 0;
          }
          uVar9 = (ulong)(ushort)(*(ushort *)((long)puVar10 + 1) << 8 |
                                 *(ushort *)((long)puVar10 + 1) >> 8);
          uVar7 = *(byte *)((long)puVar10 - uVar9) - 0x7f;
          pcVar14 = (compile_block_8 *)(ulong)uVar7;
          pcVar13 = pcVar14;
          if (uVar7 < 0x11) {
            pcVar13 = (compile_block_8 *)
                      ((long)&switchD_001827dc::switchdataD_001a941c +
                      (long)(int)(&switchD_001827dc::switchdataD_001a941c)[(long)pcVar14]);
            switch(pcVar14) {
            case (compile_block_8 *)0x0:
            case (compile_block_8 *)0x1:
            case (compile_block_8 *)0x6:
              return (uint)!bVar5;
            case (compile_block_8 *)0x2:
            case (compile_block_8 *)0x3:
              return (uint)(!bVar5 && *(byte *)((long)puVar10 + (3 - uVar9)) != 0x7e);
            case (compile_block_8 *)0x4:
            case (compile_block_8 *)0x5:
              goto LAB_00182dd8;
            case (compile_block_8 *)0x7:
              if (1 < *(int *)&cb->cx - 0x1dU) {
                return 0;
              }
              break;
            case (compile_block_8 *)0xa:
            case (compile_block_8 *)0xb:
            case (compile_block_8 *)0xf:
            case (compile_block_8 *)0x10:
              if (*(int *)(lVar17 + 0x120) != 0) {
                return 0;
              }
            }
          }
          code = (PCRE2_SPTR8)
                 ((long)puVar10 +
                 (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [bVar3]);
          goto LAB_001826a4;
        }
        pcVar13 = (compile_block_8 *)0xc0000000;
        if ((0xc0000000U >> (uVar7 & 0x1f) & 1) != 0) {
          uVar7 = *(byte *)((long)puVar10 + 1) - 0x85;
          if (4 < uVar7) {
            return 0;
          }
          if ((0x15U >> (uVar7 & 0x1f) & 1) == 0) {
            return 0;
          }
          pbVar23 = (byte *)((long)puVar10 + 1);
          do {
            uVar6 = *(ushort *)(pbVar23 + 1) << 8 | *(ushort *)(pbVar23 + 1) >> 8;
            pbVar2 = pbVar23 + uVar6;
            pbVar23 = pbVar23 + uVar6;
          } while (*pbVar2 == 0x78);
          pcVar13 = cb;
          ppuVar20 = (uint8_t **)base_list;
          BVar8 = compare_opcodes(pbVar23 + 3,utf,ucp,cb,base_list,base_end,
                                  in_stack_ffffffffffffff88);
          if (BVar8 == 0) {
            return 0;
          }
          code = (PCRE2_SPTR8)
                 ((long)puVar10 +
                 (ulong)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                        [bVar3]);
          goto LAB_001826a4;
        }
      }
      if (bVar3 == 0) {
        return (uint)(*(int *)((long)&cb->cx + 4) != 0);
      }
      code = get_chr_property_list
                       ((PCRE2_SPTR8)puVar10,(BOOL)*(undefined8 *)(lVar17 + 0x10),
                        (BOOL)(compile_block_8 *)&stack0xffffffffffffffa8,(uint8_t *)pcVar13,
                        (uint32_t *)ppuVar20);
      if ((uint32_t *)code == (uint32_t *)0x0) {
        return 0;
      }
      uVar7 = *(uint *)&cb->cx;
      ppuVar20 = ppuVar1;
      if (uVar7 == 0x1d) {
        pcVar14 = (compile_block_8 *)&stack0xffffffffffffffa8;
        ppuVar19 = (uint8_t **)&stack0xffffffffffffffb0;
        uVar7 = local_58;
LAB_0018281a:
        pcVar13 = (compile_block_8 *)(ulong)uVar7;
        puVar10 = (uint32_t *)code;
        if (pcVar14 != (compile_block_8 *)&stack0xffffffffffffffa8) {
          puVar10 = base_list;
        }
        if (((0x1f < uVar7) || ((0xa3be0fc0U >> (uVar7 & 0x1f) & 1) == 0)) && (1 < uVar7 - 0x6e)) {
LAB_00182dd8:
          return 0;
        }
        uVar21 = *(uint *)ppuVar20;
        do {
          switch(uVar7) {
          case 6:
            if (0xff < uVar21) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 8;
            goto joined_r0x00182955;
          case 7:
            if (uVar21 < 0x100) {
              bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 8;
              goto joined_r0x001828c5;
            }
            break;
          case 8:
            if (0xff < uVar21) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 1;
            goto joined_r0x00182955;
          case 9:
            if (uVar21 < 0x100) {
              bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 1;
              goto joined_r0x001828c5;
            }
            break;
          case 10:
            if (0xff < uVar21) {
              return 0;
            }
            bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 0x10;
joined_r0x00182955:
            if (bVar3 == 0) {
              return 0;
            }
            break;
          case 0xb:
            if (uVar21 < 0xff) {
              bVar3 = *(byte *)(*(long *)(lVar17 + 0x20) + (ulong)uVar21) & 0x10;
              goto joined_r0x001828c5;
            }
            break;
          case 0xc:
          case 0xd:
          case 0xe:
          case 0xf:
          case 0x10:
          case 0x16:
          case 0x1a:
          case 0x1b:
          case 0x1c:
          case 0x1e:
switchD_00182855_caseD_c:
            if (uVar21 < 0x100) goto LAB_001828aa;
            break;
          case 0x11:
          case 0x15:
          case 0x17:
          case 0x19:
            if (uVar21 - 10 < 4) {
              return 0;
            }
            if (uVar21 - 0x2028 < 2) {
              return 0;
            }
            if (uVar21 == 0x85) {
              return 0;
            }
            break;
          case 0x12:
            if ((int)uVar21 < 0x2000) {
              if ((int)uVar21 < 0xa0) {
                if ((uVar21 != 9) && (uVar21 != 0x20)) {
                  return 0;
                }
              }
              else if (((uVar21 != 0xa0) && (uVar21 != 0x1680)) && (uVar21 != 0x180e)) {
                return 0;
              }
            }
            else if ((int)uVar21 < 0x202f) {
              if (10 < uVar21 - 0x2000) {
                return 0;
              }
            }
            else if (((uVar21 != 0x202f) && (uVar21 != 0x205f)) && (uVar21 != 0x3000)) {
              return 0;
            }
            break;
          case 0x13:
            if ((int)uVar21 < 0x2000) {
              if ((int)uVar21 < 0xa0) {
                if (uVar21 == 9) {
                  return 0;
                }
                if (uVar21 == 0x20) {
                  return 0;
                }
              }
              else {
                if (uVar21 == 0xa0) {
                  return 0;
                }
                if (uVar21 == 0x1680) {
                  return 0;
                }
                if (uVar21 == 0x180e) {
                  return 0;
                }
              }
            }
            else if ((int)uVar21 < 0x202f) {
              if (uVar21 - 0x2000 < 0xb) {
                return 0;
              }
            }
            else {
              if (uVar21 == 0x202f) {
                return 0;
              }
              if (uVar21 == 0x205f) {
                return 0;
              }
              if (uVar21 == 0x3000) {
                return 0;
              }
            }
            break;
          case 0x14:
            if (((3 < uVar21 - 10) && (1 < uVar21 - 0x2028)) && (uVar21 != 0x85)) {
              return 0;
            }
            break;
          case 0x18:
            break;
          case 0x1d:
            uVar22 = *(uint *)ppuVar19;
            puVar18 = (uint *)((long)ppuVar19 + 4);
            do {
              if (uVar21 == uVar22) {
                return 0;
              }
              uVar22 = *puVar18;
              puVar18 = puVar18 + 1;
            } while (uVar22 != 0xffffffff);
            break;
          case 0x1f:
            uVar22 = *(uint *)ppuVar19;
            puVar18 = (uint *)((long)ppuVar19 + 4);
            while (uVar21 != uVar22) {
              uVar22 = *puVar18;
              puVar18 = puVar18 + 1;
              if (uVar22 == 0xffffffff) {
                return 0;
              }
            }
            if (uVar21 == 0xffffffff) {
              return 0;
            }
            break;
          default:
            if (uVar7 != 0x6f) goto switchD_00182855_caseD_c;
            if (0xff < uVar21) {
              return 0;
            }
LAB_001828aa:
            bVar3 = *(byte *)((long)puVar10 + ((ulong)(uVar21 >> 3) - (ulong)*(uint *)ppuVar19)) >>
                    (uVar21 & 7) & 1;
joined_r0x001828c5:
            if (bVar3 != 0) {
              return 0;
            }
          }
          uVar21 = *(uint *)((long)ppuVar20 + 4);
          ppuVar20 = (uint8_t **)((long)ppuVar20 + 4);
        } while (uVar21 != 0xffffffff);
LAB_00182d0f:
        if (local_54 == 0) break;
        goto LAB_001826a4;
      }
      if (local_58 == 0x1d) {
        ppuVar20 = (uint8_t **)&stack0xffffffffffffffb0;
        pcVar14 = cb;
        ppuVar19 = ppuVar1;
        goto LAB_0018281a;
      }
      if ((local_58 == 0x6e || uVar7 == 0x6e) || ((utf == 0 && (uVar7 == 0x6f || local_58 == 0x6f)))
         ) {
        if ((uVar7 == 0x6e) ||
           (puVar10 = (uint32_t *)code, pcVar13 = cb, uVar21 = local_50, uVar7 == 0x6f && utf == 0))
        {
          puVar10 = base_list;
          ppuVar20 = (uint8_t **)&stack0xffffffffffffffb0;
          pcVar13 = (compile_block_8 *)&stack0xffffffffffffffa8;
          uVar21 = *(uint *)ppuVar1;
          uVar7 = local_58;
        }
        uVar16 = 0;
        switch(uVar7) {
        case 6:
          uVar16 = 1;
        case 7:
          lVar12 = *(long *)(lVar17 + 0x18) + 0x40;
          break;
        case 8:
          uVar16 = 1;
        case 9:
          lVar12 = *(long *)(lVar17 + 0x18);
          break;
        case 10:
          uVar16 = 1;
        case 0xb:
          lVar12 = *(long *)(lVar17 + 0x18) + 0xa0;
          break;
        default:
          if (1 < uVar7 - 0x6e) {
            return 0;
          }
          puVar11 = (uint32_t *)code;
          if (pcVar13 != (compile_block_8 *)&stack0xffffffffffffffa8) {
            puVar11 = base_list;
          }
          lVar12 = (long)puVar11 - (ulong)*(uint *)ppuVar20;
          goto LAB_00182cf8;
        }
        if ((bool)uVar16) {
          lVar15 = 0;
          do {
            ppuVar20 = (uint8_t **)(ulong)~(uint)*(byte *)(lVar12 + lVar15);
            if ((~(uint)*(byte *)(lVar12 + lVar15) &
                (uint)*(byte *)(((long)puVar10 - (ulong)uVar21) + lVar15)) != 0) {
              return 0;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x20);
          pcVar13 = (compile_block_8 *)0x20;
        }
        else {
LAB_00182cf8:
          pcVar13 = (compile_block_8 *)0x0;
          do {
            if ((*(byte *)(((long)puVar10 - (ulong)uVar21) + (long)pcVar13) &
                *(byte *)((long)pcVar13->small_ref_offset + lVar12 + -0x58)) != 0) {
              return 0;
            }
            pcVar13 = (compile_block_8 *)((long)&pcVar13->cx + 1);
          } while (pcVar13 != (compile_block_8 *)0x20);
        }
        goto LAB_00182d0f;
      }
      uVar7 = uVar7 - 6;
      if (0x10 < uVar7) {
        return 0;
      }
      if (0x14 < local_58 - 6) {
        return 0;
      }
      pcVar13 = (compile_block_8 *)(ulong)(local_58 - 6);
      if (*(uint8_t *)((long)pcVar13->small_ref_offset + (long)((autoposstab + uVar7)[-5] + 0x11))
          == '\0') {
        return 0;
      }
      ppuVar20 = (uint8_t **)(ulong)uVar7;
    } while (local_54 != 0);
    uVar7 = 1;
  }
  return uVar7;
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, BOOL ucp, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  PCRE2_SPTR bracode;

  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  /* At the end of a branch, skip to the end of the group. */

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  /* Inspect the next opcode. */

  switch(c)
    {
    /* We can always possessify a greedy iterator at the end of the pattern,
    which is reached after skipping over the final OP_KET. A non-greedy
    iterator must never be possessified. */

    case OP_END:
    return base_list[1] != 0;

    /* When an iterator is at the end of certain kinds of group we can inspect
    what follows the group by skipping over the closing ket. Note that this
    does not apply to OP_KETRMAX or OP_KETRMIN because what follows any given
    iteration is variable (could be another iteration or could be the next
    item). As these two opcodes are not listed in the next switch, they will
    end up as the next code to inspect, and return FALSE by virtue of being
    unsupported. */

    case OP_KET:
    case OP_KETRPOS:
    /* The non-greedy case cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    /* If the bracket is capturing it might be referenced by an OP_RECURSE
    so its last iterator can never be possessified if the pattern contains
    recursions. (This could be improved by keeping a list of group numbers that
    are called by recursion.) */

    bracode = code - GET(code, 1);
    switch(*bracode)
      {
      case OP_CBRA:
      case OP_SCBRA:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      if (cb->had_recurse) return FALSE;
      break;

      /* A script run might have to backtrack if the iterated item can match
      characters from more than one script. So give up unless repeating an
      explicit character. */

      case OP_SCRIPT_RUN:
      if (base_list[0] != OP_CHAR && base_list[0] != OP_CHARI)
        return FALSE;
      break;

      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator except for variable length lookbehinds. However, if the
      group was entered as a result of checking a previous iterator, this is
      not possible. */

      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ONCE:
      return !entered_a_group;

      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      return (bracode[1+LINK_SIZE] == OP_VREVERSE)? FALSE : !entered_a_group;

      /* Non-atomic assertions - don't possessify last iterator. This needs
      more thought. */

      case OP_ASSERT_NA:
      case OP_ASSERTBACK_NA:
      return FALSE;
      }

    /* Skip over the bracket and inspect what comes next. */

    code += PRIV(OP_lengths)[c];
    continue;

    /* Handle cases where the next item is a group. */

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    /* Check each branch. We have to recurse a level for all but the last
    branch. */

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, ucp, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA &&
        *next_code != OP_ONCE) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, ucp, cb, base_list, base_end,
         rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    /* The next opcode does not need special handling; fall through and use it
    to see if the base can be possessified. */

    default:
    break;
    }

  /* We now have the next appropriate opcode to compare with the base. Check
  for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, ucp, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return (*xclass_flags & XCL_NOT) == 0;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1u << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}